

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::curiosity::Curiosity::GetWheelContactTorque
          (ChVector<double> *__return_storage_ptr__,Curiosity *this,CuriosityWheelID id)

{
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &(((this->m_wheels)._M_elems[id].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChBody::GetContactTorque();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Curiosity::GetWheelContactTorque(CuriosityWheelID id) const {
    return m_wheels[id]->GetBody()->GetContactTorque();
}